

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_table_as_typed_root_with_size
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,flatcc_table_verifier_f *tvf)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  flatbuffers_thash_t fVar5;
  flatcc_table_verifier_descriptor_t local_30;
  ulong uVar4;
  
  iVar2 = 5;
  if (((((ulong)buf & 3) == 0) && (iVar2 = 6, bufsiz >> 3 < 0x1fffffff)) &&
     (iVar2 = 1, 0xb < bufsiz)) {
    uVar1 = *buf;
    iVar2 = 0x24;
    if ((ulong)uVar1 <= bufsiz - 4) {
      fVar5 = *(flatbuffers_thash_t *)((long)buf + 4);
      if ((thash != 0) && (fVar5 = thash, *(flatbuffers_thash_t *)((long)buf + 4) != thash)) {
        return (uint)(*(flatbuffers_thash_t *)((long)buf + 4) != thash) * 2;
      }
      local_30.ttl = 99;
      local_30.table = fVar5 + 4;
      iVar2 = 0xf;
      if (4 < local_30.table) {
        local_30.end = uVar1 + 4;
        if ((local_30.table & 3) == 0 && (ulong)local_30.table + 4 <= (ulong)local_30.end) {
          uVar3 = local_30.table - *(int *)((long)buf + (ulong)local_30.table);
          uVar4 = (ulong)uVar3;
          iVar2 = 0x1d;
          if ((uVar3 & 1) == 0 && -1 < (int)uVar3) {
            iVar2 = 0x1b;
            if (uVar4 + 2 <= (ulong)local_30.end) {
              local_30.vsize = *(ushort *)((long)buf + uVar4);
              iVar2 = 0x1e;
              if (((local_30.vsize & 1) == 0 && uVar3 + local_30.vsize <= local_30.end) &&
                 (iVar2 = 0x1c, 3 < local_30.vsize)) {
                local_30.tsize = *(ushort *)((long)buf + uVar4 + 2);
                iVar2 = 0x14;
                if ((uint)local_30.tsize <= uVar1 - fVar5) {
                  local_30.vtable = (void *)(uVar4 + (long)buf);
                  local_30.buf = buf;
                  iVar2 = (*tvf)(&local_30);
                }
              }
            }
          }
        }
      }
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_table_as_typed_root_with_size(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_typed_buffer_header_with_size(buf, &bufsiz, thash));
    return verify_table(buf, (uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}